

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvalContext.cpp
# Opt level: O3

Diagnostics * __thiscall
slang::ast::EvalContext::getAllDiagnostics(Diagnostics *__return_storage_ptr__,EvalContext *this)

{
  Diagnostic *pDVar1;
  
  (__return_storage_ptr__->super_SmallVector<slang::Diagnostic,_2UL>).
  super_SmallVectorBase<slang::Diagnostic>.data_ =
       (pointer)(__return_storage_ptr__->super_SmallVector<slang::Diagnostic,_2UL>).
                super_SmallVectorBase<slang::Diagnostic>.firstElement;
  (__return_storage_ptr__->super_SmallVector<slang::Diagnostic,_2UL>).
  super_SmallVectorBase<slang::Diagnostic>.len = 0;
  (__return_storage_ptr__->super_SmallVector<slang::Diagnostic,_2UL>).
  super_SmallVectorBase<slang::Diagnostic>.cap = 2;
  pDVar1 = (this->diags).super_SmallVector<slang::Diagnostic,_2UL>.
           super_SmallVectorBase<slang::Diagnostic>.data_;
  SmallVectorBase<slang::Diagnostic>::append<const_slang::Diagnostic_*>
            ((SmallVectorBase<slang::Diagnostic> *)__return_storage_ptr__,pDVar1,
             pDVar1 + (this->diags).super_SmallVector<slang::Diagnostic,_2UL>.
                      super_SmallVectorBase<slang::Diagnostic>.len);
  pDVar1 = (this->warnings).super_SmallVector<slang::Diagnostic,_2UL>.
           super_SmallVectorBase<slang::Diagnostic>.data_;
  SmallVectorBase<slang::Diagnostic>::append<const_slang::Diagnostic_*>
            ((SmallVectorBase<slang::Diagnostic> *)__return_storage_ptr__,pDVar1,
             pDVar1 + (this->warnings).super_SmallVector<slang::Diagnostic,_2UL>.
                      super_SmallVectorBase<slang::Diagnostic>.len);
  return __return_storage_ptr__;
}

Assistant:

Diagnostics EvalContext::getAllDiagnostics() const {
    Diagnostics results;
    results.append_range(diags);
    results.append_range(warnings);
    return results;
}